

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void __thiscall SFFile::CheckZones(SFFile *this,int start,int stop,bool instr)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  SFGenerator SVar5;
  SFBag *pSVar6;
  SFGenList *pSVar7;
  SFGenList **ppSVar8;
  SFBag *pSVar9;
  SFRange SVar10;
  SFGenerator SVar11;
  undefined3 in_register_00000009;
  uchar temp;
  long lVar12;
  SFBag **ppSVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  
  ppSVar8 = &this->PresetGenerators;
  ppSVar13 = &this->PresetBags;
  SVar11 = 0x29;
  if (CONCAT31(in_register_00000009,instr) != 0) {
    SVar11 = 0x35;
    ppSVar13 = &this->InstrBags;
    ppSVar8 = &this->InstrGenerators;
  }
  pSVar6 = *ppSVar13;
  pSVar7 = *ppSVar8;
  lVar12 = (long)start;
  lVar1 = lVar12;
  do {
    while( true ) {
      lVar14 = lVar1;
      if (stop <= lVar14) {
        return;
      }
      uVar16 = (ulong)pSVar6[lVar14].GenIndex;
      lVar1 = lVar14 + 1;
      uVar4 = pSVar6[lVar14 + 1].GenIndex;
      if (pSVar6[lVar14].GenIndex <= uVar4) break;
      pSVar9 = pSVar6 + lVar14;
      (pSVar9->KeyRange).Lo = 0xff;
      (pSVar9->KeyRange).Hi = 0xff;
      (pSVar9->VelRange).Lo = 0xff;
      (pSVar9->VelRange).Hi = 0xff;
    }
    if ((lVar14 != lVar12) && (pSVar6[lVar12].Target < 0)) {
      SVar10 = pSVar6[lVar12].VelRange;
      pSVar6[lVar14].KeyRange = pSVar6[lVar12].KeyRange;
      pSVar6[lVar14].VelRange = SVar10;
    }
    for (; uVar16 < uVar4; uVar16 = uVar16 + 1) {
      SVar5 = pSVar7[uVar16].Oper;
      if (SVar5 == 0x2c) {
        pSVar6[lVar14].VelRange = (SFRange)pSVar7[uVar16].field_1;
      }
      else if (SVar5 == 0x2b) {
        pSVar6[lVar14].KeyRange = (SFRange)pSVar7[uVar16].field_1;
      }
      else if (SVar11 == SVar5) {
        if (instr) {
          iVar15 = this->NumSamples;
        }
        else {
          iVar15 = this->NumInstruments;
        }
        if ((int)(uint)pSVar7[uVar16].field_1.uAmount < iVar15 + -1) {
          pSVar6[lVar14].Target = (uint)pSVar7[uVar16].field_1.uAmount;
        }
        break;
      }
    }
    if ((lVar14 == lVar12) || (-1 < pSVar6[lVar14].Target)) {
      bVar2 = pSVar6[lVar14].KeyRange.Lo;
      bVar3 = pSVar6[lVar14].KeyRange.Hi;
      if (bVar3 < bVar2) {
        pSVar6[lVar14].KeyRange.Lo = bVar3;
        pSVar6[lVar14].KeyRange.Hi = bVar2;
      }
    }
    else {
      pSVar9 = pSVar6 + lVar14;
      (pSVar9->KeyRange).Lo = 0xff;
      (pSVar9->KeyRange).Hi = 0xff;
      (pSVar9->VelRange).Lo = 0xff;
      (pSVar9->VelRange).Hi = 0xff;
    }
    bVar2 = pSVar6[lVar14].VelRange.Lo;
    bVar3 = pSVar6[lVar14].VelRange.Hi;
    if (bVar3 < bVar2) {
      pSVar6[lVar14].VelRange.Lo = bVar3;
      pSVar6[lVar14].VelRange.Hi = bVar2;
    }
  } while( true );
}

Assistant:

void SFFile::CheckZones(int start, int stop, bool instr)
{
	SFBag *bag;
	SFGenList *gens;
	SFGenerator terminal_gen;
	int zone_start, zone_stop;
	int i, j;

	if (!instr)
	{
		bag = PresetBags;
		gens = PresetGenerators;
		terminal_gen = GEN_instrument;
	}
	else
	{
		bag = InstrBags;
		gens = InstrGenerators;
		terminal_gen = GEN_sampleID;
	}
	for (i = start; i < stop; ++i)
	{
		zone_start = bag[i].GenIndex;
		zone_stop = bag[i + 1].GenIndex;

		if (zone_start > zone_stop)
		{
			// Skip empty zones, and mark them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
			continue;
		}

		// According to the specs, if keyRange is present, it must be the first generator.
		// If velRange is present, it may only be preceded by keyRange. In real life, there
		// exist Soundfonts that violate this rule, so we need to scan every generator.

		// Preload ranges from the global zone.
		if (i != start && bag[start].Target < 0)
		{
			bag[i].KeyRange = bag[start].KeyRange;
			bag[i].VelRange = bag[start].VelRange;
		}
		for (j = zone_start; j < zone_stop; ++j)
		{
			if (gens[j].Oper == GEN_keyRange)
			{
				bag[i].KeyRange = gens[j].Range;
			}
			else if (gens[j].Oper == GEN_velRange)
			{
				bag[i].VelRange = gens[j].Range;
			}
			else if (gens[j].Oper == terminal_gen)
			{
				if (terminal_gen == GEN_instrument && gens[j].uAmount < NumInstruments - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				else if (terminal_gen == GEN_sampleID && gens[j].uAmount < NumSamples - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				break;
			}
		}
		if (bag[i].Target < 0 && i != start)
		{
			// Only the first zone may be targetless. If any other zones are,
			// make them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
		}

		// Check for swapped ranges. (Should we fix them or ignore them?)
		if (bag[i].KeyRange.Lo > bag[i].KeyRange.Hi)
		{
			swapvalues(bag[i].KeyRange.Lo, bag[i].KeyRange.Hi);
		}
		if (bag[i].VelRange.Lo > bag[i].VelRange.Hi)
		{
			swapvalues(bag[i].VelRange.Lo, bag[i].VelRange.Hi);
		}
	}
}